

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

int64_t __thiscall
hta::storage::file::Metric::find_index_before_or_on(Metric *this,TimePoint t,int64_t sz)

{
  RawFile *this_00;
  int iVar1;
  undefined4 extraout_var;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar2;
  TimePoint TVar3;
  ssize_t sVar4;
  TimeAggregate *chunk;
  duration __nbytes;
  long extraout_RDX;
  int64_t iVar5;
  long lVar6;
  long lVar7;
  Duration interval;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> level;
  Meta m;
  void *local_60;
  void *local_58;
  long local_50;
  rep local_48;
  long local_40;
  long local_38;
  
  iVar1 = (*(this->super_Metric)._vptr_Metric[0xc])();
  iVar5 = -1;
  if (CONCAT44(extraout_var,iVar1) <=
      (long)t.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r) {
    if ((long)t.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r < extraout_RDX) {
      (**(this->super_Metric)._vptr_Metric)(&local_48);
      if ((long)t.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r < 0) {
        __assert_fail("time.time_since_epoch().count() >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/include/hta/types.hpp"
                      ,0x92,"TimePoint hta::interval_begin(TimePoint, Duration)");
      }
      lVar6 = 0;
      interval.__r = local_48;
      do {
        lVar7 = local_38 * interval.__r;
        if (local_40 < lVar7) {
          tVar2.__d.__r = (duration)epoch(this,interval);
        }
        else {
          tVar2.__d.__r =
               (duration)
               ((long)t.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r -
               (long)t.
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     .__d.__r % lVar7);
        }
        __nbytes.__r = (long)t.
                             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             .__d.__r -
                       (long)t.
                             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             .__d.__r % interval.__r;
        if ((duration)__nbytes.__r != tVar2.__d.__r) {
          (*(this->super_Metric)._vptr_Metric[6])
                    (&local_60,this,tVar2.__d.__r,__nbytes.__r,interval.__r,1);
          for (__nbytes.__r = (rep)local_60; (void *)__nbytes.__r != local_58;
              __nbytes.__r = __nbytes.__r + 0x38) {
            lVar6 = lVar6 + *(long *)(__nbytes.__r + 0x20);
          }
          if (local_60 != (void *)0x0) {
            operator_delete(local_60,local_50 - (long)local_60);
          }
        }
        TVar3 = epoch(this,interval);
        interval.__r = lVar7;
      } while ((long)TVar3.
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     .__d.__r < (long)tVar2.__d.__r);
      this_00 = &this->file_raw_;
      do {
        lVar7 = lVar6;
        if (sz <= lVar7) break;
        sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                          (this_00,(int)lVar7,(void *)0x0,__nbytes.__r);
        lVar6 = lVar7 + 1;
      } while (sVar4 <= (long)t.
                              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              .__d.__r);
      iVar5 = lVar7 + -1;
      if (iVar5 < 0) {
        __assert_fail("index >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x98,
                      "int64_t hta::storage::file::Metric::find_index_before_or_on(TimePoint, int64_t)"
                     );
      }
      sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                        (this_00,(int)iVar5,(void *)0x0,__nbytes.__r);
      if ((long)t.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r < sVar4) {
        __assert_fail("get_raw_ts(index) <= t",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x99,
                      "int64_t hta::storage::file::Metric::find_index_before_or_on(TimePoint, int64_t)"
                     );
      }
      if ((sz != lVar7) &&
         (sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                            (this_00,(int)lVar7,(void *)0x0,__nbytes.__r),
         sVar4 <= (long)t.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r)) {
        __assert_fail("index == int64_t(sz - 1) || get_raw_ts(index + 1) > t",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                      ,0x9a,
                      "int64_t hta::storage::file::Metric::find_index_before_or_on(TimePoint, int64_t)"
                     );
      }
    }
    else {
      iVar5 = sz + -1;
    }
  }
  return iVar5;
}

Assistant:

int64_t Metric::find_index_before_or_on(TimePoint t, int64_t sz)
{
    auto [begin, end] = range();
    if (begin > t)
    {
        return -1;
    }
    if (end <= t)
    {
        return sz - 1;
    }

    int64_t index = 0;
    auto m = meta();
    Duration interval = m.interval_min;

    while (true)
    {
        auto interval_next = interval * m.interval_factor;
        auto interval_begin_current = interval_begin(t, interval);
        auto interval_begin_next = interval_begin(t, interval_next);

        if (interval_next > m.interval_max)
        {
            interval_begin_next = epoch(interval);
        }

        if (interval_begin_current != interval_begin_next)
        {
            auto level = this->get(interval_begin_next, interval_begin_current, interval,
                                   { Scope::closed, Scope::open });
            for (const auto& chunk : level)
            {
                index += chunk.aggregate.count;
            }
        }

        if (interval_begin_next <= epoch(interval))
        {
            break;
        }
        interval = interval_next;
    }

    // >= index points are now *before* t
    // but we don't know if index itself is before or after t.. so go back one
    index--;
    for (; index + 1 < sz && get_raw_ts(index + 1) <= t; index++)
        ;

    assert(index >= 0); // should be covered by the check at beginning
    assert(get_raw_ts(index) <= t);
    assert(index == int64_t(sz - 1) || get_raw_ts(index + 1) > t);
    return index;
}